

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O0

void __thiscall
cppcms::impl::buddy_allocator::buddy_allocator(buddy_allocator *this,size_t memory_size)

{
  int iVar1;
  long lVar2;
  page *ppVar3;
  long in_RSI;
  buddy_allocator *in_RDI;
  page *p;
  size_t page_size;
  int bits;
  size_t reminder;
  char *pos;
  size_t local_20;
  page *local_18;
  
  in_RDI->memory_size_ = in_RSI - 0x220;
  in_RDI->max_bit_size_ = -1;
  memset(in_RDI,0,0x200);
  local_18 = (page *)memory(in_RDI);
  local_20 = in_RDI->memory_size_;
  while (iVar1 = containts_bits(local_20), 4 < iVar1) {
    lVar2 = 1L << ((byte)iVar1 & 0x3f);
    local_20 = local_20 - lVar2;
    ppVar3 = (page *)((long)&local_18->bits + lVar2);
    local_18->bits = iVar1;
    local_18->prev = (page *)0x0;
    local_18->next = (page *)0x0;
    in_RDI->free_list_[iVar1] = local_18;
    local_18 = ppVar3;
    if (in_RDI->max_bit_size_ == -1) {
      in_RDI->max_bit_size_ = iVar1;
    }
  }
  return;
}

Assistant:

buddy_allocator(size_t memory_size)
	{
		assert(sizeof(*this) <= memory_size);
		assert(sizeof(page) <= alignment * 2);
		assert(sizeof(*this) % alignment == 0);
		memory_size_ = memory_size - sizeof(*this);
		max_bit_size_ = -1;
		memset(free_list_,0,sizeof(free_list_));
		LOG("Usable memory %zd",memory_size_);
		char *pos = memory();
		size_t reminder = memory_size_;
		for(;;) {
			int bits = containts_bits(reminder);
			if(bits < alignment_bits + 1)
				break;
			size_t page_size = size_t(1) << bits;
			page *p=reinterpret_cast<page *>(pos);
			reminder -= page_size;
			LOG("Added chunk of size %zd (%d) at pos %zx reminder %zd",page_size,bits,pos - memory(),reminder);
			pos+= page_size;
			p->bits = bits;
			p->prev = 0;
			p->next = 0;
			free_list_[bits] = p;
			if(max_bit_size_ == -1)
				max_bit_size_ = bits;
		}
	}